

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mcu8str_create(mcu8str_size_t prealloc_size)

{
  ulong in_RSI;
  mcu8str *in_RDI;
  char *local_28;
  
  if (in_RSI == 0) {
    mcu8str_create_empty();
  }
  else {
    if (in_RSI < 0xfffffffe) {
      local_28 = (char *)malloc(in_RSI + 1);
    }
    else {
      local_28 = (char *)0x0;
    }
    in_RDI->c_str = local_28;
    if (in_RDI->c_str == (char *)0x0) {
      fprintf(_stderr,"ERROR: Memory allocation failed in mcu8str_create\n");
      exit(1);
    }
    *in_RDI->c_str = '\0';
    in_RDI->size = 0;
    in_RDI->buflen = (int)in_RSI + 1;
    in_RDI->owns_memory = 1;
  }
  return in_RDI;
}

Assistant:

mcu8str mcu8str_create( mcu8str_size_t prealloc_size )
  {
    MCTOOLS_STATIC_ASSERT( sizeof(int)==sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(unsigned)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(void*)>=4 );

    if ( prealloc_size == 0 )
      return mcu8str_create_empty();
    mcu8str s;
    //Limit prealloc_size, since we use unsigned type to store the size in
    //buflen below:
    s.c_str = (char*) ( MCTOOLS_STROKFORUINT(prealloc_size)
                        ? STDNS malloc( prealloc_size+1 ) : NULL);
    if ( !s.c_str ) {
#ifdef MCFILEUTILS_CPPNAMESPACE
      throw std::bad_alloc();
#else
      fprintf(stderr, "ERROR: Memory allocation failed in mcu8str_create\n");
      exit(EXIT_FAILURE);
#endif
      //gives (correctly but annoyingly) unreachable warning with MSVC
      //return mcu8str_create_empty();
    }
    s.c_str[0] = '\0';
    s.size = 0;
    s.buflen = (unsigned)(prealloc_size + 1);//cast ok, checked above
    s.owns_memory = 1;
    return s;
  }